

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O0

bool __thiscall CLOParser::getBool(CLOParser *this,char *names,bool *result)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  istream *piVar9;
  char *pcVar10;
  ulong uVar11;
  undefined1 *in_RDX;
  char *in_RSI;
  undefined8 *in_RDI;
  string keyword;
  bool in_stack_000000e7;
  istringstream iss;
  char *in_stack_000000f0;
  CLOParser *in_stack_000000f8;
  bool in_stack_00000107;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000108;
  char *in_stack_00000110;
  CLOParser *in_stack_00000118;
  string negOptions;
  string longOptions;
  string shortOptions;
  string buffer;
  undefined7 in_stack_fffffffffffffcf8;
  undefined1 in_stack_fffffffffffffcff;
  undefined1 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd01;
  undefined1 in_stack_fffffffffffffd02;
  undefined1 in_stack_fffffffffffffd03;
  undefined1 in_stack_fffffffffffffd04;
  undefined1 in_stack_fffffffffffffd05;
  undefined1 in_stack_fffffffffffffd06;
  undefined1 in_stack_fffffffffffffd07;
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [55];
  allocator local_241;
  string local_240 [32];
  istringstream local_220 [384];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  undefined1 *local_20;
  char *local_18;
  byte local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::__cxx11::string::string(local_40);
  std::__cxx11::string::string(local_60);
  std::__cxx11::string::string(local_80);
  std::__cxx11::string::string(local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,local_18,&local_241);
  std::__cxx11::istringstream::istringstream(local_220,local_240,_S_in);
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  std::__cxx11::string::string(local_278);
  while( true ) {
    piVar9 = std::operator>>((istream *)local_220,local_278);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar9 + *(long *)(*(long *)piVar9 + -0x18)));
    if (!bVar1) break;
    uVar11 = std::__cxx11::string::size();
    if (uVar11 < 3) {
      uVar11 = std::__cxx11::string::empty();
      if ((uVar11 & 1) == 0) {
        std::__cxx11::string::operator+=(local_60," ");
      }
      std::__cxx11::string::operator+=(local_60,local_278);
    }
    else {
      uVar11 = std::__cxx11::string::empty();
      if ((uVar11 & 1) == 0) {
        std::__cxx11::string::operator+=(local_80," ");
      }
      std::__cxx11::string::operator+=(local_80,local_278);
      pcVar10 = (char *)std::__cxx11::string::operator[]((ulong)local_278);
      if ((*pcVar10 == '-') &&
         (pcVar10 = (char *)std::__cxx11::string::operator[]((ulong)local_278), *pcVar10 == '-')) {
        uVar11 = std::__cxx11::string::empty();
        if ((uVar11 & 1) == 0) {
          std::__cxx11::string::operator+=(local_a0," ");
        }
        std::__cxx11::string::substr((ulong)local_2b8,(ulong)local_278);
        std::operator+(pcVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffffd07,
                                        CONCAT16(in_stack_fffffffffffffd06,
                                                 CONCAT15(in_stack_fffffffffffffd05,
                                                          CONCAT14(in_stack_fffffffffffffd04,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffffd03,
                                                  CONCAT12(in_stack_fffffffffffffd02,
                                                           CONCAT11(in_stack_fffffffffffffd01,
                                                                    in_stack_fffffffffffffd00)))))))
                      );
        std::__cxx11::string::operator+=(local_a0,local_298);
        std::__cxx11::string::~string(local_298);
        std::__cxx11::string::~string(local_2b8);
      }
    }
  }
  std::__cxx11::string::c_str();
  uVar2 = getOption<int>(in_stack_000000f8,in_stack_000000f0,_iss,in_stack_000000e7);
  if ((bool)uVar2) {
    *local_20 = 1;
    local_1 = 1;
  }
  else {
    std::__cxx11::string::c_str();
    uVar3 = getOption<int>(in_stack_000000f8,in_stack_000000f0,_iss,in_stack_000000e7);
    if ((bool)uVar3) {
      *local_20 = 0;
      local_1 = 1;
    }
    else {
      std::__cxx11::string::c_str();
      uVar4 = getOption<std::__cxx11::string>
                        (in_stack_00000118,in_stack_00000110,in_stack_00000108,in_stack_00000107);
      if ((bool)uVar4) {
        uVar11 = std::__cxx11::string::empty();
        if (((((uVar11 & 1) != 0) ||
             (uVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(
                                                  in_stack_fffffffffffffd04,
                                                  CONCAT13(in_stack_fffffffffffffd03,
                                                           CONCAT12(in_stack_fffffffffffffd02,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffd01,
                                                  in_stack_fffffffffffffd00))))))),
                                      (char *)CONCAT17(in_stack_fffffffffffffcff,
                                                       in_stack_fffffffffffffcf8)), (bool)uVar5)) ||
            (uVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,
                                                  CONCAT13(in_stack_fffffffffffffd03,
                                                           CONCAT12(in_stack_fffffffffffffd02,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffd01,
                                                  in_stack_fffffffffffffd00))))))),
                                     (char *)CONCAT17(in_stack_fffffffffffffcff,
                                                      in_stack_fffffffffffffcf8)), (bool)uVar6)) ||
           (uVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,
                                                  CONCAT13(uVar6,CONCAT12(in_stack_fffffffffffffd02,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd01,
                                                  in_stack_fffffffffffffd00))))))),
                                    (char *)CONCAT17(in_stack_fffffffffffffcff,
                                                     in_stack_fffffffffffffcf8)), (bool)uVar7)) {
          *local_20 = 1;
        }
        else {
          uVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,
                                                  CONCAT13(uVar6,CONCAT12(uVar7,CONCAT11(
                                                  in_stack_fffffffffffffd01,
                                                  in_stack_fffffffffffffd00))))))),
                                  (char *)CONCAT17(in_stack_fffffffffffffcff,
                                                   in_stack_fffffffffffffcf8));
          if ((((bool)uVar8) ||
              (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(
                                                  uVar5,CONCAT13(uVar6,CONCAT12(uVar7,CONCAT11(uVar8
                                                  ,in_stack_fffffffffffffd00))))))),
                                       (char *)CONCAT17(in_stack_fffffffffffffcff,
                                                        in_stack_fffffffffffffcf8)), bVar1)) ||
             (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5
                                                  ,CONCAT13(uVar6,CONCAT12(uVar7,CONCAT11(uVar8,
                                                  bVar1))))))),
                                      (char *)CONCAT17(in_stack_fffffffffffffcff,
                                                       in_stack_fffffffffffffcf8)), bVar1)) {
            *local_20 = 0;
          }
          else {
            *(int *)*in_RDI = *(int *)*in_RDI + -1;
            *local_20 = 1;
          }
        }
        local_1 = 1;
      }
      else {
        local_1 = 0;
      }
    }
  }
  std::__cxx11::string::~string(local_278);
  std::__cxx11::istringstream::~istringstream(local_220);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  return (bool)(local_1 & 1);
}

Assistant:

inline bool getBool(const char* names, bool& result) {
		std::string buffer;
		std::string shortOptions;
		std::string longOptions;
		std::string negOptions;
		std::istringstream iss(names);
		std::string keyword;
		while (iss >> keyword) {
			if (keyword.size() <= 2) {
				if (!shortOptions.empty()) {
					shortOptions += " ";
				}
				shortOptions += keyword;
			} else {
				if (!longOptions.empty()) {
					longOptions += " ";
				}
				longOptions += keyword;
				if (keyword[0] == '-' && keyword[1] == '-') {
					if (!negOptions.empty()) {
						negOptions += " ";
					}
					negOptions += "--no" + keyword.substr(1);
				}
			}
		}

		if (getOption(shortOptions.c_str())) {
			result = true;
			return true;
		}
		if (getOption(negOptions.c_str())) {
			result = false;
			return true;
		}

		if (getOption(longOptions.c_str(), &buffer)) {
			if (buffer.empty() || (buffer == "true" || buffer == "on" || buffer == "1")) {
				result = true;
			} else if (buffer == "false" || buffer == "off" || buffer == "0") {
				result = false;
			} else {
				--i;
				result = true;
			}
			return true;
		}
		return false;
	}